

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdset.c
# Opt level: O0

int ox_fdset_poll(fdset_s *self,long overtime)

{
  int *piVar1;
  int local_1c;
  int ret;
  long overtime_local;
  fdset_s *self_local;
  
  local_1c = poll((pollfd *)self->pollFds,(long)self->nfds,(int)overtime);
  if (local_1c == -1) {
    piVar1 = __errno_location();
    local_1c = 0;
    if (*piVar1 != 4) {
      local_1c = -1;
    }
  }
  return local_1c;
}

Assistant:

int 
ox_fdset_poll(struct fdset_s* self, long overtime)
{
#if defined PLATFORM_WINDOWS
    int ret = WSAPoll(&self->pollFds[0], self->nfds, overtime);
#else
    int ret = poll(self->pollFds, self->nfds, overtime);
#endif

    if(ret == SOCKET_ERROR)
    {
        ret = (sErrno != S_EINTR) ? -1 : 0;
    }

    return ret;
}